

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorClassifier::InternalSwap
          (SupportVectorClassifier *this,SupportVectorClassifier *other)

{
  SupportVectorClassifier *other_local;
  SupportVectorClassifier *this_local;
  
  google::protobuf::RepeatedField<int>::InternalSwap
            (&this->numberofsupportvectorsperclass_,&other->numberofsupportvectorsperclass_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->coefficients_).super_RepeatedPtrFieldBase,
             &(other->coefficients_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->rho_,&other->rho_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->proba_,&other->proba_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->probb_,&other->probb_);
  std::swap<CoreML::Specification::Kernel*>(&this->kernel_,&other->kernel_);
  std::swap<CoreML::Specification::SupportVectorClassifier::SupportVectorsUnion>
            (&this->supportVectors_,&other->supportVectors_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<CoreML::Specification::SupportVectorClassifier::ClassLabelsUnion>
            (&this->ClassLabels_,&other->ClassLabels_);
  std::swap<unsigned_int>(this->_oneof_case_ + 1,other->_oneof_case_ + 1);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void SupportVectorClassifier::InternalSwap(SupportVectorClassifier* other) {
  numberofsupportvectorsperclass_.InternalSwap(&other->numberofsupportvectorsperclass_);
  coefficients_.InternalSwap(&other->coefficients_);
  rho_.InternalSwap(&other->rho_);
  proba_.InternalSwap(&other->proba_);
  probb_.InternalSwap(&other->probb_);
  std::swap(kernel_, other->kernel_);
  std::swap(supportVectors_, other->supportVectors_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(ClassLabels_, other->ClassLabels_);
  std::swap(_oneof_case_[1], other->_oneof_case_[1]);
  std::swap(_cached_size_, other->_cached_size_);
}